

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream *
QtPrivate::readArrayBasedContainer<QList<std::pair<QByteArray,QByteArray>>>
          (QDataStream *s,QList<std::pair<QByteArray,_QByteArray>_> *c)

{
  QDataStream QVar1;
  qint64 asize;
  long lVar2;
  long in_FS_OFFSET;
  pair<QByteArray,_QByteArray> local_78;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_48,s);
  QList<std::pair<QByteArray,_QByteArray>_>::clear(c);
  asize = QDataStream::readQSizeType(s);
  if (asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<std::pair<QByteArray,_QByteArray>_>::reserve(c,asize);
    lVar2 = asize + 1;
    do {
      lVar2 = lVar2 + -1;
      if (lVar2 == 0) break;
      local_78.second.d.ptr = (char *)0x0;
      local_78.second.d.size = 0;
      local_78.first.d.size = 0;
      local_78.second.d.d = (Data *)0x0;
      local_78.first.d.d = (Data *)0x0;
      local_78.first.d.ptr = (char *)0x0;
      ::operator>>(s,&local_78);
      QVar1 = s[0x13];
      if (QVar1 == (QDataStream)0x0) {
        QList<std::pair<QByteArray,QByteArray>>::emplaceBack<std::pair<QByteArray,QByteArray>const&>
                  ((QList<std::pair<QByteArray,QByteArray>> *)c,&local_78);
      }
      else {
        QList<std::pair<QByteArray,_QByteArray>_>::clear(c);
      }
      std::pair<QByteArray,_QByteArray>::~pair(&local_78);
    } while (QVar1 == (QDataStream)0x0);
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}